

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
          (EpsCopyOutputStream *this,uint32 num,string *s,uint8 *ptr)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  uint8 *puVar4;
  uint uVar5;
  byte *in_RCX;
  void *in_RDX;
  int size_00;
  int in_ESI;
  uint8 **in_RDI;
  uint32 size;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff98;
  byte *local_28;
  uint local_1c;
  byte *local_18;
  uint local_c;
  byte *local_8;
  
  EnsureSpace((EpsCopyOutputStream *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
              in_RDI);
  uVar3 = std::__cxx11::string::size();
  uVar5 = in_ESI << 3 | 2;
  bVar2 = (byte)uVar5;
  if (uVar5 < 0x80) {
    *in_RCX = bVar2;
    local_8 = in_RCX + 1;
  }
  else {
    *in_RCX = bVar2 | 0x80;
    local_c = (uint)(in_ESI << 3) >> 7;
    if (local_c < 0x80) {
      in_RCX[1] = (byte)local_c;
      local_8 = in_RCX + 2;
    }
    else {
      pbVar1 = in_RCX + 1;
      do {
        local_18 = pbVar1;
        *local_18 = (byte)local_c | 0x80;
        local_c = local_c >> 7;
        pbVar1 = local_18 + 1;
      } while (0x7f < local_c);
      local_8 = local_18 + 2;
      local_18[1] = (byte)local_c;
    }
  }
  local_28 = local_8;
  for (local_1c = uVar3; 0x7f < local_1c; local_1c = local_1c >> 7) {
    *local_28 = (byte)local_1c | 0x80;
    local_28 = local_28 + 1;
  }
  size_00 = (int)((ulong)(local_28 + 1) >> 0x20);
  *local_28 = (byte)local_1c;
  std::__cxx11::string::data();
  puVar4 = WriteRaw((EpsCopyOutputStream *)CONCAT44(in_ESI,in_stack_ffffffffffffff98),in_RDX,size_00
                    ,(uint8 *)CONCAT44(uVar3,in_stack_ffffffffffffff80));
  return puVar4;
}

Assistant:

uint8* EpsCopyOutputStream::WriteStringOutline(uint32 num, const std::string& s,
                                               uint8* ptr) {
  EnsureSpace(&ptr);
  uint32 size = s.size();
  ptr = WriteLengthDelim(num, size, ptr);
  return WriteRaw(s.data(), size, ptr);
}